

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O2

void __thiscall
gl4cts::GLSL420Pack::LineContinuationTest::prepareShaderSourceForDraw
          (LineContinuationTest *this,SHADER_STAGES stage,bool use_version_400,shaderSource *source)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  undefined7 in_register_00000011;
  int iVar5;
  bool *text;
  pointer psVar6;
  pointer string;
  char *__s;
  char *text_00;
  bool bVar7;
  size_t position;
  qualifierSet out;
  qualifierSet in;
  string out_color_definition;
  string in_color_definition;
  string out_tex_coord_definition;
  string in_tex_coord_definition;
  string out_tex_coord_reference;
  string in_tex_coord_reference;
  string out_color_reference;
  string in_color_reference;
  
  pcVar4 = "#version 420";
  if ((int)CONCAT71(in_register_00000011,use_version_400) != 0) {
    pcVar4 = 
    "#version 400\n#extension GL_ARB_shading_language_420pack : require\n#extension GL_ARB_separate_shader_objects : enable"
    ;
  }
  text_00 = "#version 430";
  if (stage != COMPUTE_SHADER) {
    text_00 = pcVar4;
  }
  if (stage - TESS_CTRL_SHADER < 3) {
    text = (bool *)(&PTR_anon_var_dwarf_368c6a_01dce890)[stage - TESS_CTRL_SHADER];
  }
  else {
    text = glcts::fixed_sample_locations_values + 1;
  }
  in.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  out.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  in.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  in.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  out.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  out.
  super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  in_tex_coord_reference._M_dataplus._M_p._0_4_ = 2;
  std::
  vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
  ::emplace_back<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(&in,(QUALIFIERS *)&in_tex_coord_reference);
  in_tex_coord_reference._M_dataplus._M_p._0_4_ = 3;
  std::
  vector<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
  ::emplace_back<gl4cts::GLSL420Pack::Utils::QUALIFIERS>(&out,(QUALIFIERS *)&in_tex_coord_reference)
  ;
  in_tex_coord_reference._M_dataplus._M_p = (pointer)&in_tex_coord_reference.field_2;
  in_tex_coord_reference._M_string_length = 0;
  out_tex_coord_reference._M_dataplus._M_p = (pointer)&out_tex_coord_reference.field_2;
  out_tex_coord_reference._M_string_length = 0;
  in_tex_coord_reference.field_2._M_local_buf[0] = '\0';
  in_color_reference._M_dataplus._M_p = (pointer)&in_color_reference.field_2;
  in_color_reference._M_string_length = 0;
  out_color_reference._M_dataplus._M_p = (pointer)&out_color_reference.field_2;
  out_color_reference._M_string_length = 0;
  out_tex_coord_reference.field_2._M_local_buf[0] = '\0';
  in_color_reference.field_2._M_local_buf[0] = '\0';
  in_tex_coord_definition._M_dataplus._M_p = (pointer)&in_tex_coord_definition.field_2;
  in_tex_coord_definition._M_string_length = 0;
  out_tex_coord_definition._M_dataplus._M_p = (pointer)&out_tex_coord_definition.field_2;
  out_tex_coord_definition._M_string_length = 0;
  out_color_reference.field_2._M_local_buf[0] = '\0';
  in_tex_coord_definition.field_2._M_local_buf[0] = '\0';
  in_color_definition._M_dataplus._M_p = (pointer)&in_color_definition.field_2;
  in_color_definition._M_string_length = 0;
  out_color_definition._M_dataplus._M_p = (pointer)&out_color_definition.field_2;
  out_color_definition._M_string_length = 0;
  out_tex_coord_definition.field_2._M_local_buf[0] = '\0';
  in_color_definition.field_2._M_local_buf[0] = '\0';
  out_color_definition.field_2._M_local_buf[0] = '\0';
  Utils::prepareVariableStrings
            (stage,INPUT,&in,"vec2",m_texture_coordinates_name,&in_tex_coord_definition,
             &in_tex_coord_reference);
  Utils::prepareVariableStrings
            (stage,OUTPUT,&out,"vec2",m_texture_coordinates_name,&out_tex_coord_definition,
             &out_tex_coord_reference);
  Utils::prepareVariableStrings
            (stage,INPUT,&in,"vec4","color",&in_color_definition,&in_color_reference);
  Utils::prepareVariableStrings
            (stage,OUTPUT,&out,"vec4","color",&out_color_definition,&out_color_reference);
  std::__cxx11::string::append((char *)&in_tex_coord_definition);
  std::__cxx11::string::append((char *)&out_tex_coord_definition);
  std::__cxx11::string::append((char *)&in_color_definition);
  std::__cxx11::string::append((char *)&out_color_definition);
  uVar1 = stage - VERTEX_SHADER;
  if (uVar1 < 5) {
    __s = &DAT_016cb97c + *(int *)(&DAT_016cb97c + (ulong)uVar1 * 4);
    pcVar4 = &DAT_016cb990 + *(int *)(&DAT_016cb990 + (ulong)uVar1 * 4);
  }
  else {
    pcVar4 = "    SET_RESULT(result);\n    TEXTURE_COORDINATES = coordinates;\n";
    __s = "(EXPECTED_VALUE == sampled_color) &&\n        (vec4(0, 1, 0, 1) == IN_COLOR) ";
  }
  sVar2 = strlen(pcVar4);
  sVar3 = strlen(__s);
  psVar6 = (source->m_parts).
           super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_test_case).m_case - 0xb < 4) {
    std::__cxx11::string::assign((char *)psVar6);
    std::__cxx11::string::assign
              ((char *)((source->m_parts).
                        super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                        ._M_impl.super__Vector_impl_data._M_start + 1));
    replaceAllCaseTokens
              (this,&((source->m_parts).
                      super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_code);
    psVar6 = (source->m_parts).
             super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
             ._M_impl.super__Vector_impl_data._M_start + 1;
  }
  else {
    std::__cxx11::string::assign((char *)psVar6);
    std::__cxx11::string::append
              ((char *)(source->m_parts).
                       super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    psVar6 = (source->m_parts).
             super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  replaceAllCaseTokens(this,&psVar6->m_code);
  uVar1 = (this->m_test_case).m_case - 0xb;
  position = 0;
  psVar6 = (source->m_parts).
           super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
           ._M_impl.super__Vector_impl_data._M_start;
  string = psVar6 + 1;
  if (3 < uVar1) {
    string = psVar6;
  }
  Utils::replaceToken("VERSION",&position,text_00,&psVar6->m_code);
  Utils::replaceToken("STAGE_SPECIFIC",&position,text,&psVar6->m_code);
  if (stage == VERTEX_SHADER) {
    Utils::replaceToken("IN_COLOR_DEFINITION",&position,glcts::fixed_sample_locations_values + 1,
                        &psVar6->m_code);
  }
  else {
    Utils::replaceToken("IN_COLOR_DEFINITION",&position,in_color_definition._M_dataplus._M_p,
                        &psVar6->m_code);
  }
  Utils::replaceToken("IN_TEXTURE_COORDINATES_DEFINITION",&position,
                      in_tex_coord_definition._M_dataplus._M_p,&psVar6->m_code);
  Utils::replaceToken("OUT_COLOR_DEFINITION",&position,out_color_definition._M_dataplus._M_p,
                      &psVar6->m_code);
  if (stage == FRAGMENT_SHADER) {
    Utils::replaceToken("OUT_TEXTURE_COORDINATES_DEFINITION",&position,
                        glcts::fixed_sample_locations_values + 1,&psVar6->m_code);
  }
  else {
    Utils::replaceToken("OUT_TEXTURE_COORDINATES_DEFINITION",&position,
                        out_tex_coord_definition._M_dataplus._M_p,&psVar6->m_code);
  }
  Utils::replaceToken("OUT_COLOR",&position,out_color_reference._M_dataplus._M_p,&psVar6->m_code);
  if (uVar1 < 4) {
    position = 0;
  }
  Utils::replaceToken("TEXTURE_COORDINATES",&position,in_tex_coord_reference._M_dataplus._M_p,
                      &string->m_code);
  Utils::replaceToken("PASS_CONDITION",&position,__s,&string->m_code);
  position = position - (sVar3 & 0xffffffff);
  Utils::replaceToken("EXPECTED_VALUE",&position,"vec4(0, 0, 1, 1)",&string->m_code);
  if (stage != VERTEX_SHADER) {
    Utils::replaceToken("IN_COLOR",&position,in_color_reference._M_dataplus._M_p,&string->m_code);
  }
  Utils::replaceToken("STORE_RESULTS",&position,pcVar4,&string->m_code);
  position = position - (sVar2 & 0xffffffff);
  if (stage == GEOMETRY_SHADER) {
    iVar5 = 4;
    while (bVar7 = iVar5 != 0, iVar5 = iVar5 + -1, bVar7) {
      Utils::replaceToken("TEXTURE_COORDINATES",&position,out_tex_coord_reference._M_dataplus._M_p,
                          &string->m_code);
    }
  }
  else if (stage != FRAGMENT_SHADER) {
    Utils::replaceToken("TEXTURE_COORDINATES",&position,out_tex_coord_reference._M_dataplus._M_p,
                        &string->m_code);
  }
  std::__cxx11::string::~string((string *)&out_color_definition);
  std::__cxx11::string::~string((string *)&in_color_definition);
  std::__cxx11::string::~string((string *)&out_tex_coord_definition);
  std::__cxx11::string::~string((string *)&in_tex_coord_definition);
  std::__cxx11::string::~string((string *)&out_color_reference);
  std::__cxx11::string::~string((string *)&in_color_reference);
  std::__cxx11::string::~string((string *)&out_tex_coord_reference);
  std::__cxx11::string::~string((string *)&in_tex_coord_reference);
  std::
  _Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
  ::~_Vector_base(&out.
                   super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                 );
  std::
  _Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
  ::~_Vector_base(&in.
                   super__Vector_base<gl4cts::GLSL420Pack::Utils::QUALIFIERS,_std::allocator<gl4cts::GLSL420Pack::Utils::QUALIFIERS>_>
                 );
  return;
}

Assistant:

void LineContinuationTest::prepareShaderSourceForDraw(Utils::SHADER_STAGES stage, bool use_version_400,
													  Utils::shaderSource& source)
{
	/* Templates */
	static const GLchar* shader_template_part_0 =
		"VERSION\n"
		"\n"
		"// Lorem ipsum dolor sit amCOMMENT_CASEet, consectetur adipiscing elit posuere.\n"
		"\n"
		"STAGE_SPECIFIC\n"
		"\n"
		"/* Lorem ipsum dolor sit amet, conCOMMENT_CASEsectetur adipiscing elit posuere. */\n"
		"\n"
		"IN_COLOR_DEFINITION\n"
		"IN_TEXTURE_COORDINATES_DEFINITION\n"
		"OUT_COLOR_DEFINITION\n"
		"OUT_TEXTURE_COORDINATES_DEFINITION\n"
		"uniform sampler2D uni_sampler;\n"
		"\n"
		"void funFUNCTION_CASEction(in veTYPE_CASEc4 in_vVARIABLE_CASEalue)\n"
		"{\n"
		"    OUT_COLOR ASSIGNMENT_BEFORE_OPERATOR_CASE=ASSIGNMENT_AFTER_OPERATOR_CASE inVARIABLE_CASE_value;\n"
		"}\n"
		"\n"
		"#define SET_PREPROCESSOR_INSIDE_CASERESULT(XX) "
		"PREPROCESSOR_BETWEEN_CASEfuncFUNCTION_CASEtion(XPREPROCESSOR_INSIDE_CASEX)\n"
		"NEXT_TO_TERMINATION_CASE\nTERMINATION_CASE";

	static const GLchar* shader_template_part_1 =
		"void main()\n"
		"{\n"
		"    vec2 coordinates   = TEXTURE_COORDINATES;\n"
		"    vec4 sampled_color = texture(uni_sampler, coordinates);\n"
		"    vec4 result        = vec4(0, 0VECTOR_VARIABLE_INITIALIZER_CASE, 0, 1);\n"
		"\n"
		"    if (PASS_CONDITION)\n"
		"    {\n"
		"        result = vecTYPE_CASE4(VECTOR_VARIABLE_INITIALIZER_CASE0, 1, 0, 1);\n"
		"    }\n"
		"    else\n"
		"    {\n"
		"        result = vec4(coordinates.xy, sampled_color.rg);\n"
		"    }\n"
		"\n"
		"STORE_RESULTS"
		"}\n"
		"NEXT_TO_TERMINATION_CASE\nTERMINATION_CASE";

	static const GLchar* store_results_template = "    SET_RESULT(result);\n"
												  "    TEXTURE_COORDINATES = coordinates;\n";

	static const GLchar* store_results_tcs_template = "    SET_RESULT(result);\n"
													  "    TEXTURE_COORDINATES = coordinates;\n"
													  "    gl_TessLevelOuter[0] = 1.0;\n"
													  "    gl_TessLevelOuter[1] = 1.0;\n"
													  "    gl_TessLevelOuter[2] = 1.0;\n"
													  "    gl_TessLevelOuter[3] = 1.0;\n"
													  "    gl_TessLevelInner[0] = 1.0;\n"
													  "    gl_TessLevelInner[1] = 1.0;\n";

	static const GLchar* store_results_fs_template = "    SET_RESULT(result);\n";

	static const GLchar* store_results_gs_template = "    gl_Position = vec4(-1, -1, 0, 1);\n"
													 "    SET_RESULT(result);\n"
													 "    TEXTURE_COORDINATES = coordinates + vec2(-0.25, -0.25);\n"
													 "    EmitVertex();\n"
													 "    gl_Position = vec4(-1, 1, 0, 1);\n"
													 "    SET_RESULT(result);\n"
													 "    TEXTURE_COORDINATES = coordinates + vec2(-0.25, 0.25);\n"
													 "    EmitVertex();\n"
													 "    gl_Position = vec4(1, -1, 0, 1);\n"
													 "    SET_RESULT(result);\n"
													 "    TEXTURE_COORDINATES = coordinates + vec2(0.25, -0.25);\n"
													 "    EmitVertex();\n"
													 "    gl_Position = vec4(1, 1, 0, 1);\n"
													 "    SET_RESULT(result);\n"
													 "    TEXTURE_COORDINATES = coordinates + vec2(0.25, 0.25);\n"
													 "    EmitVertex();\n";

	static const GLchar* pass_condition_template = "(EXPECTED_VALUE == sampled_color) &&\n"
												   "        (vec4(0, 1, 0, 1) == IN_COLOR) ";

	static const GLchar* pass_condition_vs_template = "EXPECTED_VALUE == sampled_color";

	/* Tokens to be replaced with GLSL stuff */
	static const GLchar* token_version		  = "VERSION";
	static const GLchar* token_stage_specific = "STAGE_SPECIFIC";

	static const GLchar* token_in_color_definition		= "IN_COLOR_DEFINITION";
	static const GLchar* token_in_tex_coord_definition  = "IN_TEXTURE_COORDINATES_DEFINITION";
	static const GLchar* token_out_color_definition		= "OUT_COLOR_DEFINITION";
	static const GLchar* token_out_tex_coord_definition = "OUT_TEXTURE_COORDINATES_DEFINITION";

	static const GLchar* token_expected_value	  = "EXPECTED_VALUE";
	static const GLchar* token_texture_coordinates = "TEXTURE_COORDINATES";
	static const GLchar* token_in_color			   = "IN_COLOR";
	static const GLchar* token_out_color		   = "OUT_COLOR";

	static const GLchar* token_store_results  = "STORE_RESULTS";
	static const GLchar* token_pass_condition = "PASS_CONDITION";

	/* Name of variable and empty string*/
	static const GLchar* color_name = "color";
	static const GLchar* empty		= "";

	/* GLSL stuff */
	const GLchar* version				= getVersionString(stage, use_version_400);
	const GLchar* stage_specific_layout = getStageSpecificLayout(stage);
	const GLchar* expected_value		= getExpectedValueString();

	/* Qualifiers */
	Utils::qualifierSet in;
	Utils::qualifierSet out;
	in.push_back(Utils::QUAL_IN);
	out.push_back(Utils::QUAL_OUT);

	/* In/Out variables definitions and references */
	std::string in_tex_coord_reference;
	std::string out_tex_coord_reference;
	std::string in_color_reference;
	std::string out_color_reference;
	std::string in_tex_coord_definition;
	std::string out_tex_coord_definition;
	std::string in_color_definition;
	std::string out_color_definition;

	Utils::prepareVariableStrings(stage, Utils::INPUT, in, "vec2", m_texture_coordinates_name, in_tex_coord_definition,
								  in_tex_coord_reference);
	Utils::prepareVariableStrings(stage, Utils::OUTPUT, out, "vec2", m_texture_coordinates_name,
								  out_tex_coord_definition, out_tex_coord_reference);
	Utils::prepareVariableStrings(stage, Utils::INPUT, in, "vec4", color_name, in_color_definition, in_color_reference);
	Utils::prepareVariableStrings(stage, Utils::OUTPUT, out, "vec4", color_name, out_color_definition,
								  out_color_reference);

	in_tex_coord_definition.append(";");
	out_tex_coord_definition.append(";");
	in_color_definition.append(";");
	out_color_definition.append(";");

	/* Select pass condition and store results tempaltes */
	const GLchar* store_results  = store_results_template;
	const GLchar* pass_condition = pass_condition_template;

	switch (stage)
	{
	case Utils::FRAGMENT_SHADER:
		store_results = store_results_fs_template;
		break;
	case Utils::GEOMETRY_SHADER:
		store_results = store_results_gs_template;
		break;
	case Utils::TESS_CTRL_SHADER:
		store_results = store_results_tcs_template;
		break;
	case Utils::VERTEX_SHADER:
		pass_condition = pass_condition_vs_template;
		break;
	default:
		break;
	};
	const GLuint store_results_length  = static_cast<GLuint>(strlen(store_results));
	const GLuint pass_condition_length = static_cast<GLuint>(strlen(pass_condition));

	/* Init strings with templates and replace all CASE tokens */
	if (true == isShaderMultipart())
	{
		source.m_parts[0].m_code = shader_template_part_0;
		source.m_parts[1].m_code = shader_template_part_1;

		replaceAllCaseTokens(source.m_parts[0].m_code);
		replaceAllCaseTokens(source.m_parts[1].m_code);
	}
	else
	{
		source.m_parts[0].m_code = shader_template_part_0;
		source.m_parts[0].m_code.append(shader_template_part_1);

		replaceAllCaseTokens(source.m_parts[0].m_code);
	}

	/* Get memory for shader source parts */
	const bool   is_multipart		  = isShaderMultipart();
	size_t		 position			  = 0;
	std::string& shader_source_part_0 = source.m_parts[0].m_code;
	std::string& shader_source_part_1 = (true == is_multipart) ? source.m_parts[1].m_code : source.m_parts[0].m_code;

	/* Replace tokens */
	/* Part 0 */
	Utils::replaceToken(token_version, position, version, shader_source_part_0);

	Utils::replaceToken(token_stage_specific, position, stage_specific_layout, shader_source_part_0);

	if (Utils::VERTEX_SHADER != stage)
	{
		Utils::replaceToken(token_in_color_definition, position, in_color_definition.c_str(), shader_source_part_0);
	}
	else
	{
		Utils::replaceToken(token_in_color_definition, position, empty, shader_source_part_0);
	}
	Utils::replaceToken(token_in_tex_coord_definition, position, in_tex_coord_definition.c_str(), shader_source_part_0);
	Utils::replaceToken(token_out_color_definition, position, out_color_definition.c_str(), shader_source_part_0);
	if (Utils::FRAGMENT_SHADER == stage)
	{
		Utils::replaceToken(token_out_tex_coord_definition, position, empty, shader_source_part_0);
	}
	else
	{
		Utils::replaceToken(token_out_tex_coord_definition, position, out_tex_coord_definition.c_str(),
							shader_source_part_0);
	}

	Utils::replaceToken(token_out_color, position, out_color_reference.c_str(), shader_source_part_0);

	/* Part 1 */
	if (true == is_multipart)
	{
		position = 0;
	}

	Utils::replaceToken(token_texture_coordinates, position, in_tex_coord_reference.c_str(), shader_source_part_1);

	Utils::replaceToken(token_pass_condition, position, pass_condition, shader_source_part_1);
	position -= pass_condition_length;

	Utils::replaceToken(token_expected_value, position, expected_value, shader_source_part_1);
	if (Utils::VERTEX_SHADER != stage)
	{
		Utils::replaceToken(token_in_color, position, in_color_reference.c_str(), shader_source_part_1);
	}

	Utils::replaceToken(token_store_results, position, store_results, shader_source_part_1);
	position -= store_results_length;

	if (Utils::GEOMETRY_SHADER == stage)
	{
		for (GLuint i = 0; i < 4; ++i)
		{
			Utils::replaceToken(token_texture_coordinates, position, out_tex_coord_reference.c_str(),
								shader_source_part_1);
		}
	}
	else if (Utils::FRAGMENT_SHADER == stage)
	{
		/* Nothing to be done */
	}
	else
	{
		Utils::replaceToken(token_texture_coordinates, position, out_tex_coord_reference.c_str(), shader_source_part_1);
	}
}